

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandomGen.cpp
# Opt level: O0

int64_t __thiscall RandomGen::binom_draw(RandomGen *this,int64_t N0,double prob)

{
  result_type_conflict2 rVar1;
  binomial_distribution<long> local_b0;
  double local_20;
  double prob_local;
  int64_t N0_local;
  RandomGen *this_local;
  
  local_20 = prob;
  prob_local = (double)N0;
  N0_local = (int64_t)this;
  std::binomial_distribution<long>::binomial_distribution(&local_b0,N0,prob);
  rVar1 = std::binomial_distribution<long>::operator()(&local_b0,&this->rng);
  return rVar1;
}

Assistant:

int64_t RandomGen::binom_draw(int64_t N0, double prob) {
  return std::binomial_distribution<int64_t>(N0, prob)(rng);
}